

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaInfo::addSchemaInfo(SchemaInfo *this,SchemaInfo *toAdd,ListType aListType)

{
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *pBVar1;
  bool bVar2;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar3;
  XMLSize_t XVar4;
  SchemaInfo *pSVar5;
  XMLSize_t local_48;
  XMLSize_t j;
  XMLSize_t i;
  XMLSize_t size;
  ListType aListType_local;
  SchemaInfo *toAdd_local;
  SchemaInfo *this_local;
  
  if (aListType == IMPORT) {
    if (this->fImportedInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pRVar3 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::SchemaInfo>::RefVectorOf(pRVar3,4,false,this->fMemoryManager);
      this->fImportedInfoList = pRVar3;
    }
    bVar2 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement
                      (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
                       toAdd);
    if (!bVar2) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement
                (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,toAdd);
      updateImportingInfo(toAdd,this);
    }
  }
  else {
    if (this->fIncludeInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pRVar3 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::SchemaInfo>::RefVectorOf(pRVar3,8,false,this->fMemoryManager);
      this->fIncludeInfoList = pRVar3;
      this->fAdoptInclude = true;
    }
    bVar2 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement
                      (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,toAdd
                      );
    if (!bVar2) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement
                (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,toAdd);
      if (toAdd->fIncludeInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        toAdd->fIncludeInfoList = this->fIncludeInfoList;
      }
      else if (toAdd->fIncludeInfoList != this->fIncludeInfoList) {
        XVar4 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::size
                          (&toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)
        ;
        for (j = 0; j < XVar4; j = j + 1) {
          pBVar1 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
          pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                             (&toAdd->fIncludeInfoList->
                               super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,j);
          bVar2 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar1,pSVar5);
          if (!bVar2) {
            pBVar1 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
            pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                               (&toAdd->fIncludeInfoList->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,j);
            BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement(pBVar1,pSVar5);
          }
        }
        XVar4 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::size
                          (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>);
        for (local_48 = 0; local_48 < XVar4; local_48 = local_48 + 1) {
          pBVar1 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
          pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                             (&this->fIncludeInfoList->
                               super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,local_48);
          bVar2 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::containsElement(pBVar1,pSVar5);
          if (!bVar2) {
            pBVar1 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
            pSVar5 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                               (&this->fIncludeInfoList->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,local_48);
            BaseRefVectorOf<xercesc_4_0::SchemaInfo>::addElement(pBVar1,pSVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void SchemaInfo::addSchemaInfo(SchemaInfo* const toAdd,
                                      const ListType aListType) {

    if (aListType == IMPORT) {

        if (!fImportedInfoList)
            fImportedInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

        if (!fImportedInfoList->containsElement(toAdd)) {

            fImportedInfoList->addElement(toAdd);
            toAdd->updateImportingInfo(this);
        }
    }
    else {

        if (!fIncludeInfoList) {

            fIncludeInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(8, false, fMemoryManager);
            fAdoptInclude = true;
        }

        if (!fIncludeInfoList->containsElement(toAdd)) {

		    fIncludeInfoList->addElement(toAdd);
            //code was originally:
            //toAdd->fIncludeInfoList = fIncludeInfoList;
            //however for handling multiple imports this was causing
            //to schemaInfo's to have the same fIncludeInfoList which they
            //both owned so when it was deleted it crashed.
			if (toAdd->fIncludeInfoList) {
			   if (toAdd->fIncludeInfoList != fIncludeInfoList) {
                   XMLSize_t size = toAdd->fIncludeInfoList->size();
                   for (XMLSize_t i=0; i<size; i++) {
                       if (!fIncludeInfoList->containsElement(toAdd->fIncludeInfoList->elementAt(i))) {
                            fIncludeInfoList->addElement(toAdd->fIncludeInfoList->elementAt(i));
                       }
                   }
                   size = fIncludeInfoList->size();
                   for (XMLSize_t j=0; j<size; j++) {
                       if (!toAdd->fIncludeInfoList->containsElement(fIncludeInfoList->elementAt(j))) {
                            toAdd->fIncludeInfoList->addElement(fIncludeInfoList->elementAt(j));
                       }
                   }
			   }
			}
			else {
				toAdd->fIncludeInfoList = fIncludeInfoList;
			}
        }
    }
}